

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O3

void __thiscall
procxx::pipe_ostreambuf::pipe_ostreambuf
          (pipe_ostreambuf *this,size_t buffer_size,size_t put_back_size)

{
  pointer pcVar1;
  allocator_type local_31;
  
  *(code **)this = __assert_fail;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  std::locale::locale((locale *)&this->field_0x38);
  *(undefined ***)this = &PTR__pipe_ostreambuf_001732c8;
  this->put_back_size_ = put_back_size;
  pipe_t::pipe_t(&this->stdout_pipe_);
  std::vector<char,_std::allocator<char>_>::vector
            (&this->in_buffer_,put_back_size + buffer_size,&local_31);
  pcVar1 = (this->in_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)&this->field_0x8 = pcVar1;
  *(pointer *)&this->field_0x10 = pcVar1;
  *(pointer *)&this->field_0x18 = pcVar1;
  return;
}

Assistant:

pipe_ostreambuf(size_t buffer_size = 512, size_t put_back_size = 8)
      : put_back_size_{put_back_size}, in_buffer_(buffer_size + put_back_size) {
    auto end = &in_buffer_.back() + 1;
    setg(end, end, end);
  }